

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

Variable * __thiscall
rsg::VariableManager::allocate(VariableManager *this,VariableType *type,Storage storage,char *name)

{
  VariableScope *this_00;
  ValueScope *this_01;
  int iVar1;
  Variable *variable;
  ValueEntry *valueEntry;
  ValueEntry *local_38;
  
  this_00 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  this_01 = (this->m_valueScopeStack).
            super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  iVar1 = VariableType::getScalarSize(type);
  variable = VariableScope::allocate(this_00,type,STORAGE_LOCAL,name);
  local_38 = ValueScope::allocate(this_01,variable);
  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::push_back
            (&this->m_entryCache,&local_38);
  this->m_numAllocatedScalars = this->m_numAllocatedScalars + iVar1;
  setStorage(this,variable,storage);
  return variable;
}

Assistant:

Variable* VariableManager::allocate (const VariableType& type, Variable::Storage storage, const char* name)
{
	VariableScope&	varScope	= getCurVariableScope();
	ValueScope&		valueScope	= getCurValueScope();
	int				numScalars	= type.getScalarSize();

	// Allocate in current scope
	Variable* variable = varScope.allocate(type, Variable::STORAGE_LOCAL, name);

	// Allocate value entry
	ValueEntry* valueEntry = valueScope.allocate(variable);

	// Add to cache
	m_entryCache.push_back(valueEntry);

	m_numAllocatedScalars += numScalars;

	// Set actual storage - affects uniform/shader in allocations.
	setStorage(variable, storage);

	return variable;
}